

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::AddInternal(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
              *this,JavascriptPromise *key,int data,uint targetBucket)

{
  EntryType *pEVar1;
  EntryType *local_38;
  EntryType *current;
  uint depth;
  EntryType *entry;
  uint targetBucket_local;
  int data_local;
  JavascriptPromise *key_local;
  SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
  *this_local;
  
  pEVar1 = GetFreeEntry(this);
  pEVar1->key = key;
  pEVar1->value = data;
  pEVar1->next = this->table[targetBucket];
  this->table[targetBucket] = pEVar1;
  this->count = this->count + 1;
  current._4_4_ = 0;
  for (local_38 = this->table[targetBucket]; local_38 != (EntryType *)0x0; local_38 = local_38->next
      ) {
    current._4_4_ = current._4_4_ + 1;
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,current._4_4_);
  }
  return pEVar1;
}

Assistant:

EntryType* AddInternal(TKey key, TData data, uint targetBucket)
    {
        if(resize && !disableResize && IsDenserThan<MaxAverageChainLength>())
        {
            Resize(SizePolicy::GetSize(size*2, &modFunctionIndex));
            // After resize - we will need to recalculate the bucket
            targetBucket = HashKeyToBucket(key);
        }

        EntryType* entry = GetFreeEntry();
        entry->key = key;
        entry->value = data;
        entry->next = table[targetBucket];
        table[targetBucket] = entry;
        count++;

#if PROFILE_DICTIONARY
        uint depth = 0;
        for (EntryType * current = table[targetBucket] ; current != nullptr; current = current->next)
        {
            ++depth;
        }
        if (stats)
            stats->Insert(depth);
#endif
        return entry;
    }